

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_lengthi<char,char16_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *extraout_RDX;
  wchar32 wVar8;
  jessilib *this;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  decode_result dVar12;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  char *local_40;
  
  pcVar4 = in_prefix._M_str;
  pcVar6 = (char *)in_prefix._M_len;
  pcVar9 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  local_40 = (char *)0x0;
  pcVar10 = pcVar6;
  do {
    if ((this == (jessilib *)0x0) || (pcVar10 == (char *)0x0)) {
      if (pcVar10 != (char *)0x0) {
        return 0;
      }
      return (size_t)local_40;
    }
    in_string_00._M_str = pcVar6;
    in_string_00._M_len = (size_t)pcVar9;
    dVar12 = decode_codepoint_utf8<char>(this,in_string_00);
    pcVar7 = (char *)dVar12.units;
    wVar8 = (wchar32)(ushort)*pcVar4;
    lVar11 = 1;
    pcVar6 = pcVar7;
    if ((pcVar10 != (char *)0x1) && ((wVar8 & 0xfc00U) == 0xd800)) {
      uVar5 = (ushort)pcVar4[1] & 0xfc00;
      pcVar6 = (char *)(ulong)uVar5;
      if (uVar5 == 0xdc00) {
        wVar8 = (uint)(ushort)*pcVar4 * 0x400 + (uint)(ushort)pcVar4[1] + L'\xfca02400';
        lVar11 = 2;
      }
    }
    if (pcVar7 == (char *)0x0) {
LAB_0025f6d0:
      bVar1 = false;
    }
    else {
      if (dVar12.codepoint != wVar8) {
        iVar2 = jessilib::fold(dVar12.codepoint);
        iVar3 = jessilib::fold(wVar8);
        pcVar6 = extraout_RDX;
        if (iVar2 != iVar3) goto LAB_0025f6d0;
      }
      pcVar9 = pcVar9 + (long)pcVar7;
      this = this + -(long)pcVar7;
      pcVar4 = pcVar4 + lVar11;
      pcVar10 = pcVar10 + -lVar11;
      local_40 = local_40 + (long)pcVar7;
      bVar1 = true;
    }
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}